

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

void __thiscall
helics::ActionMessage::ActionMessage
          (ActionMessage *this,action_t startingAction,GlobalFederateId sourceId,
          GlobalFederateId destId)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  SmallBuffer *this_00;
  
  *in_RDI = in_ESI;
  in_RDI[1] = 0;
  in_RDI[2] = in_EDX;
  this_00 = (SmallBuffer *)(in_RDI + 3);
  memset(this_00,0,4);
  InterfaceHandle::InterfaceHandle((InterfaceHandle *)this_00);
  in_RDI[4] = in_ECX;
  memset((InterfaceHandle *)(in_RDI + 5),0,4);
  InterfaceHandle::InterfaceHandle((InterfaceHandle *)(in_RDI + 5));
  *(undefined2 *)(in_RDI + 6) = 0;
  *(undefined2 *)((long)in_RDI + 0x1a) = 0;
  in_RDI[7] = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 0xc) = 0;
  *(undefined8 *)(in_RDI + 0xe) = 0;
  SmallBuffer::SmallBuffer(this_00);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x5012fb);
  return;
}

Assistant:

ActionMessage::ActionMessage(action_message_def::action_t startingAction,
                             GlobalFederateId sourceId,
                             GlobalFederateId destId):
    messageAction(startingAction), source_id(sourceId), dest_id(destId)
{
}